

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O1

_Bool getPrimaries(khr_df_primaries_e primaries,Primaries *p)

{
  sPrimaryMapping *psVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  ulong uVar10;
  sPrimaryMapping *psVar11;
  sPrimaryMapping *psVar12;
  _Bool _Var13;
  
  psVar11 = primaryMap;
  _Var13 = true;
  if (primaryMap[0].dfPrimaryEnum != primaries) {
    uVar9 = 0;
    psVar12 = primaryMap;
    do {
      uVar10 = uVar9;
      if (uVar10 == 10) {
        return uVar10 < 10;
      }
      psVar11 = psVar12 + 1;
      psVar1 = psVar12 + 1;
      uVar9 = uVar10 + 1;
      psVar12 = psVar11;
    } while (psVar1->dfPrimaryEnum != primaries);
    _Var13 = uVar10 < 10;
  }
  fVar5 = (psVar11->primaries).Rx;
  fVar6 = (psVar11->primaries).Ry;
  fVar7 = (psVar11->primaries).Gx;
  fVar8 = (psVar11->primaries).Gy;
  fVar2 = (psVar11->primaries).By;
  fVar3 = (psVar11->primaries).Wx;
  fVar4 = (psVar11->primaries).Wy;
  p->Bx = (psVar11->primaries).Bx;
  p->By = fVar2;
  p->Wx = fVar3;
  p->Wy = fVar4;
  p->Rx = fVar5;
  p->Ry = fVar6;
  p->Gx = fVar7;
  p->Gy = fVar8;
  return _Var13;
}

Assistant:

bool getPrimaries(khr_df_primaries_e primaries, Primaries *p) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].dfPrimaryEnum == primaries) {
            *p = primaryMap[i].primaries;
            return true;
        }
    }

    /* No match */
    return false;
}